

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  cJSON_bool cVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  cJSON *pcVar10;
  size_t sVar11;
  long lVar12;
  uchar number_buffer [26];
  double local_50;
  uchar local_48 [40];
  
  cVar3 = 0;
  if (output_buffer == (printbuffer *)0x0 || item == (cJSON *)0x0) {
    return 0;
  }
  bVar2 = (byte)item->type;
  if (bVar2 < 0x10) {
    switch(bVar2) {
    case 1:
      puVar6 = ensure(output_buffer,6);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      builtin_memcpy(puVar6,"false",6);
      break;
    case 2:
      puVar6 = ensure(output_buffer,5);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      builtin_memcpy(puVar6,"true",5);
      break;
    default:
      goto switchD_0011e6f3_caseD_3;
    case 4:
      puVar6 = ensure(output_buffer,5);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      builtin_memcpy(puVar6,"null",5);
      break;
    case 8:
      dVar1 = item->valuedouble;
      if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
        builtin_memcpy(local_48,"null",5);
        uVar4 = 4;
      }
      else {
        uVar4 = sprintf((char *)local_48,"%1.15g");
        iVar5 = __isoc99_sscanf(local_48,"%lg",&local_50);
        if (iVar5 == 1) {
          if ((local_50 == dVar1) && (!NAN(local_50) && !NAN(dVar1))) goto LAB_0011eaa8;
        }
        uVar4 = sprintf((char *)local_48,"%1.17g");
      }
LAB_0011eaa8:
      if (0x19 < uVar4) {
        return 0;
      }
      uVar8 = (ulong)uVar4;
      puVar6 = ensure(output_buffer,uVar8 + 1);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      uVar9 = 0;
      if (uVar4 != 0) {
        do {
          puVar6[uVar9] = local_48[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      puVar6[uVar9] = '\0';
      output_buffer->offset = output_buffer->offset + uVar8;
    }
  }
  else {
    if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        cVar3 = print_string_ptr((uchar *)item->valuestring,output_buffer);
        return cVar3;
      }
      if (bVar2 != 0x20) {
        return 0;
      }
      pcVar10 = item->child;
      puVar6 = ensure(output_buffer,1);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      *puVar6 = '[';
      output_buffer->offset = output_buffer->offset + 1;
      output_buffer->depth = output_buffer->depth + 1;
      for (; pcVar10 != (cJSON *)0x0; pcVar10 = pcVar10->next) {
        cVar3 = print_value(pcVar10,output_buffer);
        if (cVar3 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar11 = output_buffer->offset;
          sVar7 = strlen((char *)(output_buffer->buffer + sVar11));
          output_buffer->offset = sVar7 + sVar11;
        }
        if (pcVar10->next != (cJSON *)0x0) {
          uVar8 = (ulong)(output_buffer->format == 0);
          puVar6 = ensure(output_buffer,uVar8 ^ 3);
          if (puVar6 == (uchar *)0x0) {
            return 0;
          }
          *puVar6 = ',';
          if (output_buffer->format == 0) {
            puVar6 = puVar6 + 1;
          }
          else {
            puVar6[1] = ' ';
            puVar6 = puVar6 + 2;
          }
          *puVar6 = '\0';
          output_buffer->offset = output_buffer->offset + (2 - uVar8);
        }
      }
      puVar6 = ensure(output_buffer,2);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      puVar6[0] = ']';
      puVar6[1] = '\0';
    }
    else {
      if (bVar2 != 0x40) {
        if (bVar2 != 0x80) {
          return 0;
        }
        if (item->valuestring == (char *)0x0) {
          return 0;
        }
        sVar7 = strlen(item->valuestring);
        puVar6 = ensure(output_buffer,sVar7 + 1);
        if (puVar6 == (uchar *)0x0) {
          return 0;
        }
        memcpy(puVar6,item->valuestring,sVar7 + 1);
        goto LAB_0011eb5e;
      }
      pcVar10 = item->child;
      uVar8 = (ulong)(output_buffer->format == 0);
      puVar6 = ensure(output_buffer,uVar8 ^ 3);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      *puVar6 = '{';
      output_buffer->depth = output_buffer->depth + 1;
      if (output_buffer->format != 0) {
        puVar6[1] = '\n';
      }
      output_buffer->offset = output_buffer->offset + (2 - uVar8);
      for (; pcVar10 != (cJSON *)0x0; pcVar10 = pcVar10->next) {
        if (output_buffer->format != 0) {
          puVar6 = ensure(output_buffer,output_buffer->depth);
          if (puVar6 == (uchar *)0x0) {
            return 0;
          }
          uVar8 = output_buffer->depth;
          if (uVar8 != 0) {
            uVar9 = 0;
            do {
              puVar6[uVar9] = '\t';
              uVar9 = uVar9 + 1;
              uVar8 = output_buffer->depth;
            } while (uVar9 < uVar8);
          }
          output_buffer->offset = output_buffer->offset + uVar8;
          if (puVar6 == (uchar *)0x0) {
            return 0;
          }
        }
        cVar3 = print_string_ptr((uchar *)pcVar10->string,output_buffer);
        if (cVar3 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar11 = output_buffer->offset;
          sVar7 = strlen((char *)(output_buffer->buffer + sVar11));
          output_buffer->offset = sVar7 + sVar11;
        }
        sVar11 = 2 - (ulong)(output_buffer->format == 0);
        puVar6 = ensure(output_buffer,sVar11);
        if (puVar6 == (uchar *)0x0) {
          return 0;
        }
        *puVar6 = ':';
        if (output_buffer->format != 0) {
          puVar6[1] = '\t';
        }
        output_buffer->offset = output_buffer->offset + sVar11;
        cVar3 = print_value(pcVar10,output_buffer);
        if (cVar3 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar11 = output_buffer->offset;
          sVar7 = strlen((char *)(output_buffer->buffer + sVar11));
          output_buffer->offset = sVar7 + sVar11;
        }
        lVar12 = ((ulong)(pcVar10->next != (cJSON *)0x0) + 1) - (ulong)(output_buffer->format == 0);
        puVar6 = ensure(output_buffer,lVar12 + 1);
        if (puVar6 == (uchar *)0x0) {
          return 0;
        }
        if (pcVar10->next != (cJSON *)0x0) {
          *puVar6 = ',';
          puVar6 = puVar6 + 1;
        }
        if (output_buffer->format != 0) {
          *puVar6 = '\n';
          puVar6 = puVar6 + 1;
        }
        *puVar6 = '\0';
        output_buffer->offset = output_buffer->offset + lVar12;
      }
      if (output_buffer->format == 0) {
        sVar11 = 2;
      }
      else {
        sVar11 = output_buffer->depth + 1;
      }
      puVar6 = ensure(output_buffer,sVar11);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
        uVar8 = 0;
        do {
          puVar6[uVar8] = '\t';
          uVar8 = uVar8 + 1;
        } while (uVar8 < output_buffer->depth - 1);
        puVar6 = puVar6 + uVar8;
      }
      puVar6[0] = '}';
      puVar6[1] = '\0';
    }
    output_buffer->depth = output_buffer->depth - 1;
  }
LAB_0011eb5e:
  cVar3 = 1;
switchD_0011e6f3_caseD_3:
  return cVar3;
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}